

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_benchmark.c
# Opt level: O0

int main(void)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  float cycle_per_op_8;
  uint64_t S_8;
  timespec ts_17;
  timespec ts_16;
  int i_6;
  int wrong_answer_6;
  uint64_t min_diff_6;
  uint64_t cycles_diff_8;
  uint64_t cycles_final_8;
  uint64_t cycles_start_8;
  int k;
  bitset_container_t *B1;
  float cycle_per_op_7;
  uint64_t S_7;
  timespec ts_15;
  timespec ts_14;
  size_t j_1;
  int sum_1;
  uint64_t cycles_diff_7;
  uint64_t cycles_final_7;
  uint64_t cycles_start_7;
  float cycle_per_op_6;
  uint64_t S_6;
  timespec ts_13;
  timespec ts_12;
  size_t j;
  int sum;
  uint64_t cycles_diff_6;
  uint64_t cycles_final_6;
  uint64_t cycles_start_6;
  float cycle_per_op_5;
  uint64_t S_5;
  timespec ts_11;
  timespec ts_10;
  int i_5;
  int wrong_answer_5;
  uint64_t min_diff_5;
  uint64_t cycles_diff_5;
  uint64_t cycles_final_5;
  uint64_t cycles_start_5;
  uint32_t *out;
  int card;
  uint16_t *testvalues;
  size_t nbrtestvalues;
  bitset_container_t *Bt;
  int howmany;
  float cycle_per_op_4;
  uint64_t S_4;
  timespec ts_9;
  timespec ts_8;
  int i_4;
  int wrong_answer_4;
  uint64_t min_diff_4;
  uint64_t cycles_diff_4;
  uint64_t cycles_final_4;
  uint64_t cycles_start_4;
  float cycle_per_op_3;
  uint64_t S_3;
  timespec ts_7;
  timespec ts_6;
  int i_3;
  int wrong_answer_3;
  uint64_t min_diff_3;
  uint64_t cycles_diff_3;
  uint64_t cycles_final_3;
  uint64_t cycles_start_3;
  float cycle_per_op_2;
  uint64_t S_2;
  timespec ts_5;
  timespec ts_4;
  int i_2;
  int wrong_answer_2;
  uint64_t min_diff_2;
  uint64_t cycles_diff_2;
  uint64_t cycles_final_2;
  uint64_t cycles_start_2;
  float cycle_per_op_1;
  uint64_t S_1;
  timespec ts_3;
  timespec ts_2;
  int i_1;
  int wrong_answer_1;
  uint64_t min_diff_1;
  uint64_t cycles_diff_1;
  uint64_t cycles_final_1;
  uint64_t cycles_start_1;
  int answer;
  float cycle_per_op;
  uint64_t S;
  timespec ts_1;
  timespec ts;
  int i;
  int wrong_answer;
  uint64_t min_diff;
  uint64_t cycles_diff;
  uint64_t cycles_final;
  uint64_t cycles_start;
  bitset_container_t *B;
  int size;
  undefined4 in_stack_fffffffffffffbe8;
  uint32_t in_stack_fffffffffffffbec;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  bitset_container_t *pbVar4;
  float local_3ec;
  float local_3e0;
  float local_3d4;
  float local_3cc;
  float local_3b8;
  float local_3b0;
  float local_39c;
  float local_388;
  float local_37c;
  float local_374;
  float local_368;
  float local_360;
  timespec local_350;
  timespec local_340;
  int local_330;
  int local_32c;
  ulong local_328;
  ulong local_320;
  long local_318;
  long local_310;
  int local_304;
  bitset_container_t *local_300;
  float local_2f4;
  ulong local_2f0;
  timespec local_2e8;
  timespec local_2d8;
  ulong local_2c8;
  int local_2bc;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  float local_29c;
  ulong local_298;
  timespec local_290;
  timespec local_280;
  ulong local_270;
  int local_264;
  long local_260;
  long local_258;
  long local_250;
  float local_244;
  ulong local_240;
  timespec local_238;
  timespec local_228;
  int local_218;
  int local_214;
  ulong local_210;
  ulong local_208;
  long local_200;
  long local_1f8;
  void *local_1f0;
  uint local_1e4;
  void *local_1e0;
  ulong local_1d8;
  bitset_container_t *local_1d0;
  int local_1c8;
  float local_1c4;
  ulong local_1c0;
  timespec local_1b8;
  timespec local_1a8;
  int local_198;
  int local_194;
  ulong local_190;
  ulong local_188;
  long local_180;
  long local_178;
  float local_16c;
  undefined8 local_168;
  timespec local_160;
  timespec local_150;
  int local_140;
  int local_13c;
  ulong local_138;
  ulong local_130;
  long local_128;
  long local_120;
  float local_114;
  undefined8 local_110;
  timespec local_108;
  timespec local_f8;
  int local_e8;
  int local_e4;
  ulong local_e0;
  ulong local_d8;
  long local_d0;
  long local_c8;
  float local_bc;
  ulong local_b8;
  timespec local_b0;
  timespec local_a0;
  int local_90;
  int local_8c;
  ulong local_88;
  ulong local_80;
  long local_78;
  long local_70;
  int local_68;
  float local_64;
  ulong local_60;
  timespec local_58;
  timespec local_48;
  int local_38;
  int local_34;
  ulong local_30;
  ulong local_28;
  long local_20;
  long local_18;
  bitset_container_t *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_8 = 0x5555;
  tellmeall();
  printf("bitset container benchmarks\n");
  local_10 = bitset_container_create();
  printf("%s: ","set_test(B)");
  fflush((FILE *)0x0);
  local_30 = 0xffffffffffffffff;
  local_34 = 0;
  for (local_38 = 0; local_38 < 500; local_38 = local_38 + 1) {
    clock_gettime(3,&local_48);
    local_18 = local_48.tv_sec * 1000000000 + local_48.tv_nsec;
    iVar1 = set_test((bitset_container_t *)
                     CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    if (iVar1 != 0) {
      local_34 = 1;
    }
    clock_gettime(3,&local_58);
    local_20 = local_58.tv_sec * 1000000000 + local_58.tv_nsec;
    local_28 = local_20 - local_18;
    if (local_28 < local_30) {
      local_30 = local_28;
    }
  }
  local_60 = (ulong)local_8;
  local_360 = (float)local_30;
  local_368 = (float)local_60;
  local_64 = local_360 / local_368;
  printf(" %.2f cycles per operation",(double)local_64);
  if (local_34 != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  local_68 = get_test((bitset_container_t *)
                      CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  local_8 = 0x10000;
  printf("%s: ","get_test(B)");
  fflush((FILE *)0x0);
  local_88 = 0xffffffffffffffff;
  local_8c = 0;
  for (local_90 = 0; local_90 < 500; local_90 = local_90 + 1) {
    clock_gettime(3,&local_a0);
    local_70 = local_a0.tv_sec * 1000000000 + local_a0.tv_nsec;
    iVar1 = get_test((bitset_container_t *)
                     CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    if (iVar1 != local_68) {
      local_8c = 1;
    }
    clock_gettime(3,&local_b0);
    local_78 = local_b0.tv_sec * 1000000000 + local_b0.tv_nsec;
    local_80 = local_78 - local_70;
    if (local_80 < local_88) {
      local_88 = local_80;
    }
  }
  local_b8 = (ulong)local_8;
  local_374 = (float)local_88;
  local_37c = (float)local_b8;
  local_bc = local_374 / local_37c;
  printf(" %.2f cycles per operation",(double)local_bc);
  if (local_8c != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_cardinality(B)");
  fflush((FILE *)0x0);
  local_e0 = 0xffffffffffffffff;
  local_e4 = 0;
  for (local_e8 = 0; local_e8 < 500; local_e8 = local_e8 + 1) {
    clock_gettime(3,&local_f8);
    local_c8 = local_f8.tv_sec * 1000000000 + local_f8.tv_nsec;
    iVar1 = bitset_container_cardinality(local_10);
    if (iVar1 != local_68) {
      local_e4 = 1;
    }
    clock_gettime(3,&local_108);
    local_d0 = local_108.tv_sec * 1000000000 + local_108.tv_nsec;
    local_d8 = local_d0 - local_c8;
    if (local_d8 < local_e0) {
      local_e0 = local_d8;
    }
  }
  local_110 = 1;
  local_388 = (float)local_e0;
  local_114 = local_388 / 1.0;
  printf(" %.2f cycles per operation",(double)local_114);
  if (local_e4 != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_compute_cardinality(B)");
  fflush((FILE *)0x0);
  local_138 = 0xffffffffffffffff;
  local_13c = 0;
  for (local_140 = 0; local_140 < 500; local_140 = local_140 + 1) {
    clock_gettime(3,&local_150);
    local_120 = local_150.tv_sec * 1000000000 + local_150.tv_nsec;
    iVar1 = bitset_container_compute_cardinality
                      ((bitset_container_t *)
                       CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    if (iVar1 != local_68) {
      local_13c = 1;
    }
    clock_gettime(3,&local_160);
    local_128 = local_160.tv_sec * 1000000000 + local_160.tv_nsec;
    local_130 = local_128 - local_120;
    if (local_130 < local_138) {
      local_138 = local_130;
    }
  }
  local_168 = 0x400;
  local_39c = (float)local_138;
  local_16c = local_39c / 1024.0;
  printf(" %.2f cycles per operation",(double)local_16c);
  if (local_13c != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  local_8 = 0x5555;
  printf("%s: ","unset_test(B)");
  fflush((FILE *)0x0);
  local_190 = 0xffffffffffffffff;
  local_194 = 0;
  for (local_198 = 0; local_198 < 500; local_198 = local_198 + 1) {
    clock_gettime(3,&local_1a8);
    local_178 = local_1a8.tv_sec * 1000000000 + local_1a8.tv_nsec;
    iVar1 = unset_test((bitset_container_t *)
                       CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    if (iVar1 != 0) {
      local_194 = 1;
    }
    clock_gettime(3,&local_1b8);
    local_180 = local_1b8.tv_sec * 1000000000 + local_1b8.tv_nsec;
    local_188 = local_180 - local_178;
    if (local_188 < local_190) {
      local_190 = local_188;
    }
  }
  local_1c0 = (ulong)local_8;
  local_3b0 = (float)local_190;
  local_3b8 = (float)local_1c0;
  local_1c4 = local_3b0 / local_3b8;
  printf(" %.2f cycles per operation",(double)local_1c4);
  if (local_194 != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  bitset_container_free((bitset_container_t *)0x1033ad);
  for (local_1c8 = 0x1000; local_1c8 < 0x10001; local_1c8 = local_1c8 << 1) {
    local_1d0 = bitset_container_create();
    while (iVar1 = bitset_container_cardinality(local_1d0), pbVar4 = local_1d0, iVar1 < local_1c8) {
      uVar2 = pcg32_random();
      bitset_container_set(pbVar4,(uint16_t)uVar2);
    }
    local_1d8 = 0x400;
    local_1e0 = malloc(0x800);
    uVar3 = bitset_container_cardinality(local_1d0);
    printf("\n number of values in container = %d\n",(ulong)uVar3);
    local_1e4 = bitset_container_cardinality(local_1d0);
    local_1f0 = malloc((ulong)local_1e4 * 4 + 0x20);
    printf("%s: ","bitset_container_to_uint32_array(out, Bt, 1234)");
    fflush((FILE *)0x0);
    local_210 = 0xffffffffffffffff;
    local_214 = 0;
    for (local_218 = 0; local_218 < 500; local_218 = local_218 + 1) {
      clock_gettime(3,&local_228);
      local_1f8 = local_228.tv_sec * 1000000000 + local_228.tv_nsec;
      uVar3 = bitset_container_to_uint32_array
                        ((uint32_t *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                         (bitset_container_t *)
                         CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                         in_stack_fffffffffffffbec);
      if (uVar3 != local_1e4) {
        local_214 = 1;
      }
      clock_gettime(3,&local_238);
      local_200 = local_238.tv_sec * 1000000000 + local_238.tv_nsec;
      local_208 = local_200 - local_1f8;
      if (local_208 < local_210) {
        local_210 = local_208;
      }
    }
    local_240 = (ulong)(int)local_1e4;
    local_3cc = (float)local_210;
    local_3d4 = (float)local_240;
    local_244 = local_3cc / local_3d4;
    printf(" %.2f cycles per operation",(double)local_244);
    if (local_214 != 0) {
      printf(" [ERROR]");
    }
    printf("\n");
    fflush((FILE *)0x0);
    free(local_1f0);
    printf("%s %s: ","bitset_container_get","bitset_cache_prefetch");
    fflush((FILE *)0x0);
    local_264 = 0;
    for (local_270 = 0; local_270 < local_1d8; local_270 = local_270 + 1) {
      bitset_cache_prefetch
                ((bitset_container_t *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0)
                );
      clock_gettime(3,&local_280);
      local_250 = local_280.tv_sec * 1000000000 + local_280.tv_nsec;
      bitset_container_get(local_1d0,*(uint16_t *)((long)local_1e0 + local_270 * 2));
      clock_gettime(3,&local_290);
      local_258 = local_290.tv_sec * 1000000000 + local_290.tv_nsec;
      local_260 = local_258 - local_250;
      local_264 = local_264 + (int)local_260;
    }
    local_298 = local_1d8;
    local_3e0 = (float)local_1d8;
    local_29c = (float)local_264 / local_3e0;
    printf(" %.2f cycles per operation",(double)local_29c);
    printf("\n");
    fflush((FILE *)0x0);
    printf("%s %s: ","bitset_container_get","bitset_cache_flush");
    fflush((FILE *)0x0);
    local_2bc = 0;
    for (local_2c8 = 0; local_2c8 < local_1d8; local_2c8 = local_2c8 + 1) {
      bitset_cache_flush((bitset_container_t *)
                         CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
      clock_gettime(3,&local_2d8);
      local_2a8 = local_2d8.tv_sec * 1000000000 + local_2d8.tv_nsec;
      bitset_container_get(local_1d0,*(uint16_t *)((long)local_1e0 + local_2c8 * 2));
      clock_gettime(3,&local_2e8);
      local_2b0 = local_2e8.tv_sec * 1000000000 + local_2e8.tv_nsec;
      local_2b8 = local_2b0 - local_2a8;
      local_2bc = local_2bc + (int)local_2b8;
    }
    local_2f0 = local_1d8;
    local_3ec = (float)local_1d8;
    local_2f4 = (float)local_2bc / local_3ec;
    printf(" %.2f cycles per operation",(double)local_2f4);
    printf("\n");
    fflush((FILE *)0x0);
    free(local_1e0);
    bitset_container_free((bitset_container_t *)0x103a7f);
  }
  printf("\n");
  benchmark_logical_operations();
  local_300 = bitset_container_create();
  for (local_304 = 0; local_304 < 0x1000; local_304 = local_304 + 1) {
    pbVar4 = local_300;
    uVar2 = ranged_random((uint32_t)local_300);
    bitset_container_set(pbVar4,(uint16_t)uVar2);
  }
  local_68 = get_cardinality_through_conversion_to_array
                       ((bitset_container_t *)
                        CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  printf("%s: ","get_cardinality_through_conversion_to_array(B1)");
  fflush((FILE *)0x0);
  local_328 = 0xffffffffffffffff;
  local_32c = 0;
  for (local_330 = 0; local_330 < 500; local_330 = local_330 + 1) {
    clock_gettime(3,&local_340);
    local_310 = local_340.tv_sec * 1000000000 + local_340.tv_nsec;
    iVar1 = get_cardinality_through_conversion_to_array
                      ((bitset_container_t *)
                       CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    if (iVar1 != local_68) {
      local_32c = 1;
    }
    clock_gettime(3,&local_350);
    local_318 = local_350.tv_sec * 1000000000 + local_350.tv_nsec;
    local_320 = local_318 - local_310;
    if (local_320 < local_328) {
      local_328 = local_320;
    }
  }
  printf(" %.2f cycles per operation",(double)((float)local_328 / 1024.0));
  if (local_32c != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  bitset_container_free((bitset_container_t *)0x103d45);
  return 0;
}

Assistant:

int main() {
    int size = (1 << 16) / 3;
    tellmeall();
    printf("bitset container benchmarks\n");
    bitset_container_t* B = bitset_container_create();
    BEST_TIME(set_test(B), 0, repeat, size);
    int answer = get_test(B);
    size = 1 << 16;
    BEST_TIME(get_test(B), answer, repeat, size);
    BEST_TIME(bitset_container_cardinality(B), answer, repeat, 1);
    BEST_TIME(bitset_container_compute_cardinality(B), answer, repeat,
              BITSET_CONTAINER_SIZE_IN_WORDS);

    size = (1 << 16) / 3;
    BEST_TIME(unset_test(B), 0, repeat, size);
    bitset_container_free(B);

    for (int howmany = 4096; howmany <= (1 << 16); howmany *= 2) {
        bitset_container_t* Bt = bitset_container_create();
        while (bitset_container_cardinality(Bt) < howmany) {
            bitset_container_set(Bt, (uint16_t)pcg32_random());
        }
        size_t nbrtestvalues = 1024;
        uint16_t* testvalues = malloc(nbrtestvalues * sizeof(uint16_t));
        printf("\n number of values in container = %d\n",
               bitset_container_cardinality(Bt));
        int card = bitset_container_cardinality(Bt);
        uint32_t* out = malloc(sizeof(uint32_t) * (unsigned)card + 32);
        BEST_TIME(bitset_container_to_uint32_array(out, Bt, 1234), card, repeat,
                  card);
        free(out);
        BEST_TIME_PRE_ARRAY(Bt, bitset_container_get, bitset_cache_prefetch,
                            testvalues, nbrtestvalues);
        BEST_TIME_PRE_ARRAY(Bt, bitset_container_get, bitset_cache_flush,
                            testvalues, nbrtestvalues);
        free(testvalues);
        bitset_container_free(Bt);
    }
    printf("\n");

    benchmark_logical_operations();

    // next we are going to benchmark conversion from bitset to array (an
    // important step)
    bitset_container_t* B1 = bitset_container_create();
    for (int k = 0; k < 4096; ++k) {
        bitset_container_set(B1, (uint16_t)ranged_random(1 << 16));
    }
    answer = get_cardinality_through_conversion_to_array(B1);
    BEST_TIME(get_cardinality_through_conversion_to_array(B1), answer, repeat,
              BITSET_CONTAINER_SIZE_IN_WORDS);

    bitset_container_free(B1);
    return 0;
}